

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QShape.cpp
# Opt level: O0

void __thiscall QShape::QShape(QShape *this,Shape shape,QWidget *parent)

{
  QShape *widgetP;
  QShape *in_RDX;
  QFrame *in_RDI;
  Shape in_stack_ffffffffffffffac;
  QShapePrivate *in_stack_ffffffffffffffd0;
  QFlags<Qt::WindowType> local_1c [7];
  
  QFlags<Qt::WindowType>::QFlags(local_1c);
  QFrame::QFrame(in_RDI,(QWidget *)in_RDX,(QFlags_conflict1 *)(ulong)local_1c[0].i);
  *(undefined ***)in_RDI = &PTR_metaObject_00267170;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QShape_00267328;
  widgetP = (QShape *)operator_new(0x60);
  QShapePrivate::QShapePrivate(in_stack_ffffffffffffffd0,widgetP);
  *(QShape **)(in_RDI + 0x28) = widgetP;
  setShape(in_RDX,in_stack_ffffffffffffffac);
  return;
}

Assistant:

QShape::QShape(QShape::Shape shape, QWidget *parent)
    : QFrame(parent)
    , d(new QShapePrivate(this)) {
    setShape(shape);
}